

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_coefficients_to_spectrum.cc
# Opt level: O1

bool __thiscall
sptk::FilterCoefficientsToSpectrum::Run
          (FilterCoefficientsToSpectrum *this,
          vector<double,_std::allocator<double>_> *numerator_coefficients,
          vector<double,_std::allocator<double>_> *denominator_coefficients,
          vector<double,_std::allocator<double>_> *spectrum,Buffer *buffer)

{
  vector<double,_std::allocator<double>_> *this_00;
  vector<double,_std::allocator<double>_> *this_01;
  vector<double,_std::allocator<double>_> *this_02;
  int iVar1;
  int iVar2;
  int iVar3;
  pointer pdVar4;
  pointer pdVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  bool bVar8;
  int iVar9;
  size_t sVar10;
  ulong uVar11;
  pointer pdVar12;
  long lVar13;
  ulong uVar14;
  uint uVar15;
  double dVar16;
  double dVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  
  if (this->is_valid_ == true) {
    iVar1 = this->num_numerator_order_;
    if ((((long)(numerator_coefficients->super__Vector_base<double,_std::allocator<double>_>).
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(numerator_coefficients->super__Vector_base<double,_std::allocator<double>_>).
                _M_impl.super__Vector_impl_data._M_start >> 3 == (long)iVar1 + 1) &&
        (buffer != (Buffer *)0x0)) && (spectrum != (vector<double,_std::allocator<double>_> *)0x0))
    {
      iVar2 = this->num_denominator_order_;
      if ((long)(denominator_coefficients->super__Vector_base<double,_std::allocator<double>_>).
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(denominator_coefficients->super__Vector_base<double,_std::allocator<double>_>).
                _M_impl.super__Vector_impl_data._M_start >> 3 == (long)iVar2 + 1) {
        iVar3 = this->fft_length_;
        iVar9 = iVar3 / 2;
        uVar15 = iVar9 + 1;
        uVar11 = (ulong)(int)uVar15;
        if ((long)(spectrum->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(spectrum->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start >> 3 != uVar11) {
          std::vector<double,_std::allocator<double>_>::resize(spectrum,uVar11);
        }
        this_00 = &buffer->fast_fourier_transform_input_;
        if ((ulong)((long)(buffer->fast_fourier_transform_input_).
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)(buffer->fast_fourier_transform_input_).
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start >> 3) < (ulong)(long)this->fft_length_) {
          std::vector<double,_std::allocator<double>_>::resize(this_00,(long)this->fft_length_);
        }
        this_01 = &buffer->numerator_of_transfer_function_;
        if ((ulong)((long)(buffer->numerator_of_transfer_function_).
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)(buffer->numerator_of_transfer_function_).
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start >> 3) < uVar11) {
          std::vector<double,_std::allocator<double>_>::resize(this_01,uVar11);
        }
        this_02 = &buffer->denominator_of_transfer_function_;
        if ((ulong)((long)(buffer->denominator_of_transfer_function_).
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)(buffer->denominator_of_transfer_function_).
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start >> 3) < uVar11) {
          std::vector<double,_std::allocator<double>_>::resize(this_02,uVar11);
        }
        if (iVar1 != 0) {
          pdVar4 = (numerator_coefficients->super__Vector_base<double,_std::allocator<double>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          sVar10 = (long)(numerator_coefficients->
                         super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_finish - (long)pdVar4;
          if (sVar10 != 0) {
            memmove((this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_start,pdVar4,sVar10);
          }
          pdVar12 = (buffer->fast_fourier_transform_input_).
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish;
          pdVar4 = (buffer->fast_fourier_transform_input_).
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start + (long)iVar1 + 1;
          if (pdVar4 != pdVar12) {
            memset(pdVar4,0,((long)pdVar12 + (-8 - (long)pdVar4) & 0xfffffffffffffff8U) + 8);
          }
          bVar8 = RealValuedFastFourierTransform::Run
                            (&this->fast_fourier_transform_,this_00,
                             &buffer->fast_fourier_transform_real_output_,
                             &buffer->fast_fourier_transform_imaginary_output_,
                             &buffer->fast_fourier_transform_buffer_);
          if (!bVar8) {
            return false;
          }
          if (-2 < iVar3) {
            pdVar4 = (buffer->fast_fourier_transform_real_output_).
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pdVar12 = (buffer->fast_fourier_transform_imaginary_output_).
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start;
            pdVar5 = (this_01->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            uVar11 = 0;
            do {
              dVar17 = pdVar4[uVar11];
              dVar16 = pdVar12[uVar11];
              pdVar5[uVar11] = dVar17 * dVar17 + dVar16 * dVar16;
              uVar11 = uVar11 + 1;
            } while (uVar15 != uVar11);
          }
        }
        if (iVar2 != 0) {
          pdVar4 = (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          *pdVar4 = 1.0;
          pdVar12 = (denominator_coefficients->super__Vector_base<double,_std::allocator<double>_>).
                    _M_impl.super__Vector_impl_data._M_start + 1;
          sVar10 = (long)(denominator_coefficients->
                         super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_finish - (long)pdVar12;
          if (sVar10 != 0) {
            memmove(pdVar4 + 1,pdVar12,sVar10);
          }
          pdVar12 = (buffer->fast_fourier_transform_input_).
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish;
          pdVar4 = (buffer->fast_fourier_transform_input_).
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start + (long)iVar2 + 1;
          if (pdVar4 != pdVar12) {
            memset(pdVar4,0,((long)pdVar12 + (-8 - (long)pdVar4) & 0xfffffffffffffff8U) + 8);
          }
          bVar8 = RealValuedFastFourierTransform::Run
                            (&this->fast_fourier_transform_,this_00,
                             &buffer->fast_fourier_transform_real_output_,
                             &buffer->fast_fourier_transform_imaginary_output_,
                             &buffer->fast_fourier_transform_buffer_);
          if (!bVar8) {
            return false;
          }
          if (-2 < iVar3) {
            pdVar4 = (buffer->fast_fourier_transform_real_output_).
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pdVar12 = (buffer->fast_fourier_transform_imaginary_output_).
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start;
            pdVar5 = (this_02->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            uVar11 = 0;
            do {
              dVar17 = pdVar4[uVar11];
              dVar16 = pdVar12[uVar11];
              dVar17 = dVar17 * dVar17 + dVar16 * dVar16;
              pdVar5[uVar11] = dVar17;
              if ((dVar17 == 0.0) && (!NAN(dVar17))) {
                return false;
              }
              uVar11 = uVar11 + 1;
            } while (uVar15 != uVar11);
          }
        }
        auVar7 = _DAT_00113500;
        auVar6 = _DAT_001134f0;
        dVar17 = *(denominator_coefficients->super__Vector_base<double,_std::allocator<double>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        dVar17 = dVar17 * dVar17;
        if ((dVar17 != 0.0) || (NAN(dVar17))) {
          if (iVar1 == 0 && iVar2 == 0) {
            pdVar4 = (spectrum->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            pdVar12 = (spectrum->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_finish;
            if (pdVar4 != pdVar12) {
              dVar16 = *(numerator_coefficients->super__Vector_base<double,_std::allocator<double>_>
                        )._M_impl.super__Vector_impl_data._M_start;
              dVar16 = dVar17 * dVar16 * dVar16;
              uVar14 = (long)pdVar12 + (-8 - (long)pdVar4);
              auVar20._8_4_ = (int)uVar14;
              auVar20._0_8_ = uVar14;
              auVar20._12_4_ = (int)(uVar14 >> 0x20);
              auVar18._0_8_ = uVar14 >> 3;
              auVar18._8_8_ = auVar20._8_8_ >> 3;
              uVar11 = 0;
              auVar18 = auVar18 ^ _DAT_00113500;
              do {
                auVar19._8_4_ = (int)uVar11;
                auVar19._0_8_ = uVar11;
                auVar19._12_4_ = (int)(uVar11 >> 0x20);
                auVar20 = (auVar19 | auVar6) ^ auVar7;
                if ((bool)(~(auVar20._4_4_ == auVar18._4_4_ && auVar18._0_4_ < auVar20._0_4_ ||
                            auVar18._4_4_ < auVar20._4_4_) & 1)) {
                  pdVar4[uVar11] = dVar16;
                }
                if ((auVar20._12_4_ != auVar18._12_4_ || auVar20._8_4_ <= auVar18._8_4_) &&
                    auVar20._12_4_ <= auVar18._12_4_) {
                  pdVar4[uVar11 + 1] = dVar16;
                }
                uVar11 = uVar11 + 2;
              } while (((uVar14 >> 3) + 2 & 0xfffffffffffffffe) != uVar11);
            }
          }
          else if (iVar2 == 0 || iVar1 != 0) {
            pdVar4 = (this_01->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            if (iVar1 == 0 || iVar2 != 0) {
              if (uVar15 != 0) {
                pdVar12 = (spectrum->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                          super__Vector_impl_data._M_start;
                pdVar5 = (this_02->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_start;
                lVar13 = 0;
                do {
                  *(double *)((long)pdVar12 + lVar13) =
                       (*(double *)((long)pdVar4 + lVar13) * dVar17) /
                       *(double *)((long)pdVar5 + lVar13);
                  lVar13 = lVar13 + 8;
                } while ((long)iVar9 * 8 + 8 != lVar13);
              }
            }
            else if (uVar15 != 0) {
              pdVar12 = (spectrum->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_start;
              lVar13 = 0;
              do {
                *(double *)((long)pdVar12 + lVar13) = *(double *)((long)pdVar4 + lVar13) * dVar17;
                lVar13 = lVar13 + 8;
              } while ((long)iVar9 * 8 + 8 != lVar13);
            }
          }
          else if (uVar15 != 0) {
            dVar16 = *(numerator_coefficients->super__Vector_base<double,_std::allocator<double>_>).
                      _M_impl.super__Vector_impl_data._M_start;
            pdVar4 = (this_02->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            pdVar12 = (spectrum->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_start;
            lVar13 = 0;
            do {
              *(double *)((long)pdVar12 + lVar13) =
                   (dVar17 * dVar16 * dVar16) / *(double *)((long)pdVar4 + lVar13);
              lVar13 = lVar13 + 8;
            } while ((long)iVar9 * 8 + 8 != lVar13);
          }
          bVar8 = SpectrumToSpectrum::Run(&this->spectrum_to_spectrum_,spectrum);
          return bVar8;
        }
      }
    }
  }
  return false;
}

Assistant:

bool FilterCoefficientsToSpectrum::Run(
    const std::vector<double>& numerator_coefficients,
    const std::vector<double>& denominator_coefficients,
    std::vector<double>* spectrum,
    FilterCoefficientsToSpectrum::Buffer* buffer) const {
  // Check inputs.
  const int numerator_length(num_numerator_order_ + 1);
  const int denominator_length(num_denominator_order_ + 1);
  if (!is_valid_ ||
      numerator_coefficients.size() !=
          static_cast<std::size_t>(numerator_length) ||
      denominator_coefficients.size() !=
          static_cast<std::size_t>(denominator_length) ||
      NULL == spectrum || NULL == buffer) {
    return false;
  }

  // Prepare memories.
  const int output_length(fft_length_ / 2 + 1);
  if (spectrum->size() != static_cast<std::size_t>(output_length)) {
    spectrum->resize(output_length);
  }
  if (buffer->fast_fourier_transform_input_.size() <
      static_cast<std::size_t>(fft_length_)) {
    buffer->fast_fourier_transform_input_.resize(fft_length_);
  }
  if (buffer->numerator_of_transfer_function_.size() <
      static_cast<std::size_t>(output_length)) {
    buffer->numerator_of_transfer_function_.resize(output_length);
  }
  if (buffer->denominator_of_transfer_function_.size() <
      static_cast<std::size_t>(output_length)) {
    buffer->denominator_of_transfer_function_.resize(output_length);
  }

  // Calculate numerators of transfer function.
  if (1 != numerator_length) {
    std::copy(numerator_coefficients.begin(), numerator_coefficients.end(),
              buffer->fast_fourier_transform_input_.begin());
    std::fill(buffer->fast_fourier_transform_input_.begin() + numerator_length,
              buffer->fast_fourier_transform_input_.end(), 0.0);
    if (!fast_fourier_transform_.Run(
            buffer->fast_fourier_transform_input_,
            &buffer->fast_fourier_transform_real_output_,
            &buffer->fast_fourier_transform_imaginary_output_,
            &buffer->fast_fourier_transform_buffer_)) {
      return false;
    }

    const double* xr(&buffer->fast_fourier_transform_real_output_[0]);
    const double* xi(&buffer->fast_fourier_transform_imaginary_output_[0]);
    double* x(&buffer->numerator_of_transfer_function_[0]);
    for (int i(0); i < output_length; ++i) {
      x[i] = xr[i] * xr[i] + xi[i] * xi[i];
    }
  }

  // Calculate denominators of transfer function.
  if (1 != denominator_length) {
    buffer->fast_fourier_transform_input_[0] = 1.0;
    std::copy(denominator_coefficients.begin() + 1,
              denominator_coefficients.end(),
              buffer->fast_fourier_transform_input_.begin() + 1);
    std::fill(
        buffer->fast_fourier_transform_input_.begin() + denominator_length,
        buffer->fast_fourier_transform_input_.end(), 0.0);
    if (!fast_fourier_transform_.Run(
            buffer->fast_fourier_transform_input_,
            &buffer->fast_fourier_transform_real_output_,
            &buffer->fast_fourier_transform_imaginary_output_,
            &buffer->fast_fourier_transform_buffer_)) {
      return false;
    }

    const double* yr(&buffer->fast_fourier_transform_real_output_[0]);
    const double* yi(&buffer->fast_fourier_transform_imaginary_output_[0]);
    double* y(&buffer->denominator_of_transfer_function_[0]);
    for (int i(0); i < output_length; ++i) {
      y[i] = yr[i] * yr[i] + yi[i] * yi[i];
      if (0.0 == y[i]) {
        return false;
      }
    }
  }

  // Get gain of transfer function.
  const double gain(denominator_coefficients[0] * denominator_coefficients[0]);
  if (0.0 == gain) {
    return false;
  }

  // Calculate power spectrum.
  if (1 == numerator_length && 1 == denominator_length) {
    const double tmp(gain * numerator_coefficients[0] *
                     numerator_coefficients[0]);
    std::fill(spectrum->begin(), spectrum->end(), tmp);
  } else if (1 == numerator_length && 1 != denominator_length) {
    const double tmp(gain * numerator_coefficients[0] *
                     numerator_coefficients[0]);
    std::transform(
        buffer->denominator_of_transfer_function_.begin(),
        buffer->denominator_of_transfer_function_.begin() + output_length,
        spectrum->begin(), [tmp](double y) { return tmp / y; });
  } else if (1 != numerator_length && 1 == denominator_length) {
    std::transform(
        buffer->numerator_of_transfer_function_.begin(),
        buffer->numerator_of_transfer_function_.begin() + output_length,
        spectrum->begin(), [gain](double x) { return gain * x; });
  } else {
    std::transform(
        buffer->numerator_of_transfer_function_.begin(),
        buffer->numerator_of_transfer_function_.begin() + output_length,
        buffer->denominator_of_transfer_function_.begin(), spectrum->begin(),
        [gain](double x, double y) { return gain * x / y; });
  }

  if (!spectrum_to_spectrum_.Run(spectrum)) {
    return false;
  }

  return true;
}